

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

real __thiscall
fasttext::NegativeSamplingLoss::forward
          (NegativeSamplingLoss *this,vector<int,_std::allocator<int>_> *targets,int32_t targetIndex
          ,State *state,real lr,bool backprop)

{
  int32_t target;
  pointer piVar1;
  int32_t target_00;
  int32_t n;
  int iVar2;
  float fVar3;
  real rVar4;
  
  if (targetIndex < 0) {
    __assert_fail("targetIndex >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/loss.cc"
                  ,0xb3,
                  "virtual real fasttext::NegativeSamplingLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
                 );
  }
  piVar1 = (targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((ulong)(uint)targetIndex <
      (ulong)((long)(targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
    target = piVar1[(uint)targetIndex];
    fVar3 = BinaryLogisticLoss::binaryLogistic
                      (&this->super_BinaryLogisticLoss,target,state,true,lr,backprop);
    for (iVar2 = 0; iVar2 < this->neg_; iVar2 = iVar2 + 1) {
      target_00 = getNegative(this,target,&state->rng);
      rVar4 = BinaryLogisticLoss::binaryLogistic
                        (&this->super_BinaryLogisticLoss,target_00,state,false,lr,backprop);
      fVar3 = fVar3 + rVar4;
    }
    return fVar3;
  }
  __assert_fail("targetIndex < targets.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/loss.cc"
                ,0xb4,
                "virtual real fasttext::NegativeSamplingLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
               );
}

Assistant:

real NegativeSamplingLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t targetIndex,
    Model::State& state,
    real lr,
    bool backprop) {
  assert(targetIndex >= 0);
  assert(targetIndex < targets.size());
  int32_t target = targets[targetIndex];
  real loss = binaryLogistic(target, state, true, lr, backprop);

  for (int32_t n = 0; n < neg_; n++) {
    auto negativeTarget = getNegative(target, state.rng);
    loss += binaryLogistic(negativeTarget, state, false, lr, backprop);
  }
  return loss;
}